

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall RVO::Agent::computeNeighbors(Agent *this)

{
  pointer ppVar1;
  pointer ppVar2;
  float fVar3;
  float local_c;
  
  ppVar1 = (this->obstacleNeighbors_).
           super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obstacleNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->obstacleNeighbors_).
    super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  fVar3 = this->timeHorizonObst_ * this->maxSpeed_ + this->radius_;
  KdTree::computeObstacleNeighbors(this->sim_->kdTree_,this,fVar3 * fVar3);
  ppVar2 = (this->agentNeighbors_).
           super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->agentNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->agentNeighbors_).
    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  if (this->maxNeighbors_ != 0) {
    local_c = this->neighborDist_ * this->neighborDist_;
    KdTree::computeAgentNeighbors(this->sim_->kdTree_,this,&local_c);
  }
  return;
}

Assistant:

void Agent::computeNeighbors()
	{
		obstacleNeighbors_.clear();
		float rangeSq = sqr(timeHorizonObst_ * maxSpeed_ + radius_);
		sim_->kdTree_->computeObstacleNeighbors(this, rangeSq);

		agentNeighbors_.clear();

		if (maxNeighbors_ > 0) {
			rangeSq = sqr(neighborDist_);
			sim_->kdTree_->computeAgentNeighbors(this, rangeSq);
		}
	}